

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O1

int ArgPos(char *str,int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  if (1 < argc) {
    uVar2 = (ulong)(uint)argc;
    lVar3 = 1;
    do {
      iVar1 = strcmp(str,argv[lVar3]);
      if (iVar1 == 0) {
        if ((int)uVar2 != 2) {
          return (int)lVar3;
        }
        printf("Argument missing for %s\n",str);
        exit(1);
      }
      lVar3 = lVar3 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 1);
  }
  return -1;
}

Assistant:

int ArgPos(char *str, int argc, char **argv) {
  int a;
  for (a = 1; a < argc; a++) if (!strcmp(str, argv[a])) {
    if (a == argc - 1) {
      printf("Argument missing for %s\n", str);
      exit(1);
    }
    return a;
  }
  return -1;
}